

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O2

void __thiscall
TasGrid::TasmanianSparseGrid::makeWaveletGrid
          (TasmanianSparseGrid *this,int dimensions,int outputs,int depth,int order,
          vector<int,_std::allocator<int>_> *level_limits)

{
  pointer piVar1;
  pointer piVar2;
  BaseCanonicalGrid *pBVar3;
  _Alloc_hider _Var4;
  invalid_argument *piVar5;
  int order_local;
  int depth_local;
  int outputs_local;
  int dimensions_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string message;
  string local_38;
  
  order_local = order;
  depth_local = depth;
  outputs_local = outputs;
  dimensions_local = dimensions;
  if (dimensions < 1) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar5,"ERROR: makeWaveletGrid() requires positive dimensions");
  }
  else if (outputs < 0) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar5,"ERROR: makeWaveletGrid() requires non-negative outputs");
  }
  else if (depth < 0) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar5,"ERROR: makeWaveletGrid() requires non-negative depth");
  }
  else {
    if ((order & 0xfffffffdU) != 1) {
      ::std::__cxx11::to_string(&local_38,order);
      ::std::operator+(&local_78,"ERROR: makeWaveletGrid() is called with order: ",&local_38);
      ::std::operator+(&message,&local_78,", but wavelets are implemented only for orders 1 and 3.")
      ;
      ::std::__cxx11::string::~string((string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_38);
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument(piVar5,(string *)&message);
      __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,
                  ::std::invalid_argument::~invalid_argument);
    }
    piVar1 = (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((piVar1 == piVar2) || ((long)piVar2 - (long)piVar1 >> 2 == (ulong)(uint)dimensions)) {
      clear(this);
      ::std::vector<int,_std::allocator<int>_>::operator=(&this->llimits,level_limits);
      local_78._M_dataplus._M_p =
           (pointer)(this->acceleration)._M_t.
                    super___uniq_ptr_impl<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_TasGrid::AccelerationContext_*,_std::default_delete<TasGrid::AccelerationContext>_>
                    .super__Head_base<0UL,_TasGrid::AccelerationContext_*,_false>._M_head_impl;
      Utils::
      make_unique<TasGrid::GridWavelet,TasGrid::AccelerationContext*,int&,int&,int&,int&,std::vector<int,std::allocator<int>>&>
                ((Utils *)&message,(AccelerationContext **)&local_78,&dimensions_local,
                 &outputs_local,&depth_local,&order_local,&this->llimits);
      _Var4 = message._M_dataplus;
      message._M_dataplus._M_p = (pointer)0x0;
      pBVar3 = (this->base)._M_t.
               super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
               .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
      (this->base)._M_t.
      super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
      ._M_t.
      super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
      .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl =
           (BaseCanonicalGrid *)_Var4._M_p;
      if (pBVar3 != (BaseCanonicalGrid *)0x0) {
        (*pBVar3->_vptr_BaseCanonicalGrid[1])();
        if (message._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)message._M_dataplus._M_p + 8))();
        }
      }
      return;
    }
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar5,
               "ERROR: makeWaveletGrid() requires level_limits with either 0 or dimensions entries")
    ;
  }
  __cxa_throw(piVar5,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
}

Assistant:

void TasmanianSparseGrid::makeWaveletGrid(int dimensions, int outputs, int depth, int order, const std::vector<int> &level_limits){
    if (dimensions < 1) throw std::invalid_argument("ERROR: makeWaveletGrid() requires positive dimensions");
    if (outputs < 0) throw std::invalid_argument("ERROR: makeWaveletGrid() requires non-negative outputs");
    if (depth < 0) throw std::invalid_argument("ERROR: makeWaveletGrid() requires non-negative depth");
    if ((order != 1) && (order != 3)){
        std::string message = "ERROR: makeWaveletGrid() is called with order: " + std::to_string(order) + ", but wavelets are implemented only for orders 1 and 3.";
        throw std::invalid_argument(message);
    }
    if ((!level_limits.empty()) && (level_limits.size() != (size_t) dimensions)) throw std::invalid_argument("ERROR: makeWaveletGrid() requires level_limits with either 0 or dimensions entries");
    clear();
    llimits = level_limits;
    base = Utils::make_unique<GridWavelet>(acceleration.get(), dimensions, outputs, depth, order, llimits);
}